

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>::
emplace_helper<QStyleSheetStyleCaches::Tampered<QPalette>>
          (QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>> *this,QWidget **key,
          Tampered<QPalette> *args)

{
  QPalettePrivate *pQVar1;
  piter pVar2;
  Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>>
  ::findOrInsert<QWidget_const*>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>>
               **)this,key);
  this_00 = (Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    *(QWidget **)this_00 = *key;
    pQVar1 = (args->oldWidgetValue).d;
    (args->oldWidgetValue).d = (QPalettePrivate *)0x0;
    *(QPalettePrivate **)(this_00 + 8) = pQVar1;
    *(ColorGroup *)(this_00 + 0x10) = (args->oldWidgetValue).currentGroup;
    *(ResolveMask *)(this_00 + 0x18) = args->resolveMask;
  }
  else {
    QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>::
    emplaceValue<QStyleSheetStyleCaches::Tampered<QPalette>>(this_00,args);
  }
  pVar2.bucket = local_38._8_8_;
  pVar2.d = (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>
             *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }